

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O1

uint64_t amqp_get_monotonic_timestamp(void)

{
  int iVar1;
  uint64_t uVar2;
  timespec tp;
  timespec local_10;
  
  iVar1 = clock_gettime(1,&local_10);
  if (iVar1 == -1) {
    uVar2 = 0;
  }
  else {
    uVar2 = local_10.tv_sec * 1000000000 + local_10.tv_nsec;
  }
  return uVar2;
}

Assistant:

uint64_t amqp_get_monotonic_timestamp(void) {
#ifdef __hpux
  return (uint64_t)gethrtime();
#else
  struct timespec tp;
  if (-1 == clock_gettime(CLOCK_MONOTONIC, &tp)) {
    return 0;
  }

  return ((uint64_t)tp.tv_sec * AMQP_NS_PER_S + (uint64_t)tp.tv_nsec);
#endif
}